

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sales.cpp
# Opt level: O2

void __thiscall
L15_4::LabeledSales::LabeledSales(LabeledSales *this,string *lb,int y,double *gr,int n)

{
  Sales::Sales(&this->super_Sales,y,gr,n);
  (this->super_Sales)._vptr_Sales = (_func_int **)&PTR__LabeledSales_0012fb00;
  (this->_label)._M_dataplus._M_p = (pointer)&(this->_label).field_2;
  (this->_label)._M_string_length = 0;
  (this->_label).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->_label);
  return;
}

Assistant:

LabeledSales::LabeledSales(const std::string & lb, int y, const double *gr, int n): Sales(y, gr, n) {
        _label = lb;
    }